

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O3

void jsonnet_jpath_add(JsonnetVm *vm,char *path_)

{
  size_t sVar1;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (*path_ != '\0') {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = strlen(path_);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,path_,path_ + sVar1);
    if (local_40._M_dataplus._M_p[local_40._M_string_length - 1] != '/') {
      std::__cxx11::string::push_back((char)&local_40);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vm->jpaths,
               &local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void jsonnet_jpath_add(JsonnetVm *vm, const char *path_)
{
    if (std::strlen(path_) == 0)
        return;
    std::string path = path_;
    if (path[path.length() - 1] != '/')
        path += '/';
    vm->jpaths.emplace_back(path);
}